

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase726::run(TestCase726 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  SourceLocation location_04;
  SourceLocation location_05;
  SourceLocation location_06;
  SourceLocation location_07;
  SourceLocation location_08;
  SourceLocation location_09;
  SourceLocation location_10;
  SourceLocation location_11;
  SourceLocation location_12;
  SourceLocation location_13;
  size_t sVar2;
  undefined1 auVar3 [8];
  undefined1 node [8];
  ArrayDisposer *pAVar4;
  PromiseBase PVar5;
  PromiseBase PVar6;
  __pid_t _Var7;
  void *pvVar8;
  Event *pEVar9;
  Promise<int> *pPVar10;
  PromiseNode *ptrCopy_1;
  PromiseNode *ptrCopy;
  TransformPromiseNodeBase *pTVar11;
  TransformPromiseNodeBase *pTVar12;
  Exception *e;
  Promise<NoCopy> *ptrCopy_3;
  Promise<NoCopy> *ptrCopy_2;
  Array<kj::Promise<int>_> result;
  Array<kj::Promise<int>_> result_12;
  PromiseFulfillerPair<int> right;
  DebugComparison<int,_int> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  char *pcVar13;
  size_t *psVar14;
  Array<kj::Promise<int>_> *pAVar15;
  Array<kj::Promise<int>_> *pAVar16;
  char *pcVar17;
  char **ppcVar18;
  undefined8 uVar19;
  Array<kj::Promise<int>_> local_8a8;
  undefined8 uStack_890;
  Array<kj::Promise<int>_> local_888;
  undefined1 local_870 [8];
  undefined1 local_868 [8];
  ArrayDisposer *pAStack_860;
  Event *local_858;
  Array<kj::Promise<int>_> local_7e8;
  undefined8 local_7d0;
  int local_7c4;
  char *local_7c0;
  char *pcStack_7b8;
  undefined8 local_7b0;
  DebugComparison<int,_int> local_7a8 [13];
  __pid_t local_604;
  char *local_600;
  char *pcStack_5f8;
  undefined8 local_5f0;
  char *local_5e8;
  char *pcStack_5e0;
  undefined8 local_5d8;
  char *local_5d0;
  char *pcStack_5c8;
  undefined8 local_5c0;
  char *local_5b8;
  char *pcStack_5b0;
  undefined8 local_5a8;
  char *local_5a0;
  char *pcStack_598;
  undefined8 local_590;
  char *local_588;
  char *pcStack_580;
  undefined8 local_578;
  char *local_570;
  char *pcStack_568;
  undefined8 local_560;
  char *local_558;
  char *pcStack_550;
  undefined8 local_548;
  char *local_540;
  char *pcStack_538;
  undefined8 local_530;
  char *local_528;
  char *pcStack_520;
  undefined8 local_518;
  char *local_510;
  char *pcStack_508;
  undefined8 local_500;
  char *local_4f8;
  char *pcStack_4f0;
  undefined8 local_4e8;
  char *local_4e0;
  char *pcStack_4d8;
  undefined8 local_4d0;
  char *local_4c8;
  char *pcStack_4c0;
  undefined8 local_4b8;
  char *local_4b0;
  char *pcStack_4a8;
  undefined8 local_4a0;
  char *local_498;
  char *pcStack_490;
  undefined8 local_488;
  char *local_480;
  char *pcStack_478;
  undefined8 local_470;
  char *local_468;
  char *pcStack_460;
  undefined8 local_458;
  char *local_450;
  char *pcStack_448;
  undefined8 local_440;
  char *local_438;
  char *pcStack_430;
  undefined8 local_428;
  char *local_420;
  char *pcStack_418;
  undefined8 local_410;
  char *local_408;
  char *pcStack_400;
  undefined8 local_3f8;
  char *local_3f0;
  char *pcStack_3e8;
  undefined8 local_3e0;
  char *local_3d8;
  char *pcStack_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  char *pcStack_3b8;
  undefined8 local_3b0;
  char *local_3a8;
  char *pcStack_3a0;
  undefined8 local_398;
  char *local_390;
  char *pcStack_388;
  undefined8 local_380;
  char *local_378;
  char *pcStack_370;
  undefined8 local_368;
  PromiseBase local_360;
  undefined4 local_358;
  undefined4 uStack_354;
  long lStack_350;
  undefined8 uStack_348;
  undefined1 local_1c8 [8];
  Exception local_1c0;
  
  EventLoop::EventLoop((EventLoop *)local_1c8);
  _local_358 = CONCAT44(uStack_354,0xffffffff);
  lStack_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar19 = local_7a8[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_7a8[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:731:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627218;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_7a8[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:731:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar19 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627218;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar19 = local_7a8[0]._0_8_;
  if ((PromiseArenaMember *)local_7a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_7a8[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  pEVar9 = (Event *)operator_new(0x18);
  pEVar9->next = (Event *)0x0;
  (((PromiseFulfiller<int> *)&pEVar9->_vptr_Event)->super_PromiseRejector)._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006298a8;
  (((WeakFulfillerBase *)&pEVar9->loop)->super_Disposer)._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006298e0;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<int>&>
            ((PromiseDisposer *)local_7a8,(WeakFulfiller<int> *)pEVar9);
  local_868._0_4_ = local_7a8[0].left;
  local_868._4_4_ = local_7a8[0].right;
  pAStack_860 = (ArrayDisposer *)&pEVar9->loop;
  local_858 = pEVar9;
  local_8a8.ptr =
       (Promise<int> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((local_8a8.ptr)->super_PromiseBase).node.ptr = &pTVar12->super_PromiseNode;
  local_8a8.ptr[1].super_PromiseBase.node.ptr = (PromiseNode *)local_868;
  local_868 = (undefined1  [8])0x0;
  local_8a8.size_ = 2;
  local_8a8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_370 = "run";
  local_368 = 0x28000002df;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x2df;
  location.columnNumber = 0x28;
  raceSuccessful<int>(&local_888,location);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_388 = "run";
  local_380 = 0x28000002df;
  uVar19 = 0x28000002df;
  pcVar13 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar17 = "run";
  local_7a8[0].right = Promise<int>::wait((Promise<int> *)&local_888,&local_360);
  pPVar10 = local_888.ptr;
  local_7a8[0].result = local_7a8[0].right == 0x7b;
  local_7a8[0].left = 0x7b;
  local_7a8[0].op.content.ptr = " == ";
  local_7a8[0].op.content.size_ = 5;
  if ((PromiseArenaMember *)local_888.ptr != (PromiseArenaMember *)0x0) {
    local_888.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  sVar2 = local_8a8.size_;
  pPVar10 = local_8a8.ptr;
  if (local_8a8.ptr != (Promise<int> *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    local_8a8.size_ = 0;
    (**(local_8a8.disposer)->_vptr_ArrayDisposer)
              (local_8a8.disposer,pPVar10,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pcVar13,pcVar17,uVar19);
  }
  if ((local_7a8[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_7e8.size_ = CONCAT44(local_7e8.size_._4_4_,0x7b);
    local_8a8.ptr =
         (Promise<int> *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    ((local_8a8.ptr)->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    local_8a8.ptr[1].super_PromiseBase.node.ptr = (PromiseNode *)local_868;
    local_868 = (undefined1  [8])0x0;
    local_8a8.size_ = 2;
    local_8a8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_3a0 = "run";
    local_398 = 0x28000002df;
    location_00.function = "run";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_00.lineNumber = 0x2df;
    location_00.columnNumber = 0x28;
    raceSuccessful<int>(&local_888,location_00);
    local_3c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_3b8 = "run";
    local_3b0 = 0x28000002df;
    uVar19 = 0x28000002df;
    _Var7 = Promise<int>::wait((Promise<int> *)&local_888,&local_360);
    ppcVar18 = &local_7c0;
    local_7c0 = (char *)CONCAT44(local_7c0._4_4_,_Var7);
    psVar14 = &local_7e8.size_;
    kj::_::Debug::log<char_const(&)[106],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2df,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope)"
               ,(char (*) [106])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))"
               ,local_7a8,(int *)psVar14,(int *)ppcVar18);
    pPVar10 = local_888.ptr;
    if ((PromiseArenaMember *)local_888.ptr != (PromiseArenaMember *)0x0) {
      local_888.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
    }
    sVar2 = local_8a8.size_;
    pPVar10 = local_8a8.ptr;
    if (local_8a8.ptr != (Promise<int> *)0x0) {
      local_8a8.ptr = (Promise<int> *)0x0;
      local_8a8.size_ = 0;
      (**(local_8a8.disposer)->_vptr_ArrayDisposer)
                (local_8a8.disposer,pPVar10,8,sVar2,sVar2,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,psVar14,ppcVar18,uVar19);
    }
  }
  pEVar9 = local_858;
  if (local_858 != (Event *)0x0) {
    local_858 = (Event *)0x0;
    (**((Disposer *)&pAStack_860->_vptr_ArrayDisposer)->_vptr_Disposer)
              (pAStack_860,
               (_func_int *)
               ((long)&(((PromiseFulfiller<int> *)&pEVar9->_vptr_Event)->super_PromiseRejector).
                       _vptr_PromiseRejector +
               (long)(((PromiseFulfiller<int> *)&pEVar9->_vptr_Event)->super_PromiseRejector).
                     _vptr_PromiseRejector[-2]));
  }
  auVar3 = local_868;
  if (local_868 != (undefined1  [8])0x0) {
    local_868 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
  }
  if (lStack_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  _local_358 = CONCAT44(uStack_354,0xffffffff);
  lStack_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  pEVar9 = (Event *)operator_new(0x18);
  pEVar9->next = (Event *)0x0;
  (((PromiseFulfiller<int> *)&pEVar9->_vptr_Event)->super_PromiseRejector)._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006298a8;
  (((WeakFulfillerBase *)&pEVar9->loop)->super_Disposer)._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006298e0;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<int>&>
            ((PromiseDisposer *)local_7a8,(WeakFulfiller<int> *)pEVar9);
  local_868._0_4_ = local_7a8[0].left;
  local_868._4_4_ = local_7a8[0].right;
  pAStack_860 = (ArrayDisposer *)&pEVar9->loop;
  local_858 = pEVar9;
  yield();
  uVar19 = local_7a8[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_7a8[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:743:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627270;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_7a8[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:743:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar19 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627270;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar19 = local_7a8[0]._0_8_;
  if ((PromiseArenaMember *)local_7a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_7a8[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  local_8a8.ptr =
       (Promise<int> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((PromiseArenaMember *)local_8a8.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_868;
  local_868 = (undefined1  [8])0x0;
  ((PromiseArenaMember *)local_8a8.ptr)->arena = (PromiseArena *)pTVar12;
  local_8a8.size_ = 2;
  local_8a8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_3d0 = "run";
  local_3c8 = 0x60000002e9;
  location_01.function = "run";
  location_01.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_01.lineNumber = 0x2e9;
  location_01.columnNumber = 0x60;
  raceSuccessful<int>(&local_888,location_01);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_3e8 = "run";
  local_3e0 = 0x60000002e9;
  uVar19 = 0x60000002e9;
  pcVar13 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar17 = "run";
  pAVar16 = &local_888;
  local_7a8[0].right = Promise<int>::wait((Promise<int> *)pAVar16,&local_360);
  pPVar10 = local_888.ptr;
  local_7a8[0].result = local_7a8[0].right == 0x7b;
  local_7a8[0].left = 0x7b;
  local_7a8[0].op.content.ptr = " == ";
  local_7a8[0].op.content.size_ = 5;
  if ((PromiseArenaMember *)local_888.ptr != (PromiseArenaMember *)0x0) {
    local_888.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  sVar2 = local_8a8.size_;
  pPVar10 = local_8a8.ptr;
  if ((PromiseArenaMember *)local_8a8.ptr != (PromiseArenaMember *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    local_8a8.size_ = 0;
    (**(local_8a8.disposer)->_vptr_ArrayDisposer)
              (local_8a8.disposer,pPVar10,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pcVar13,pcVar17,uVar19);
  }
  if ((local_7a8[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_7e8.size_ = CONCAT44(local_7e8.size_._4_4_,0x7b);
    local_8a8.ptr =
         (Promise<int> *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    ((PromiseArenaMember *)local_8a8.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_868;
    local_868 = (undefined1  [8])0x0;
    ((PromiseArenaMember *)local_8a8.ptr)->arena = (PromiseArena *)0x0;
    local_8a8.size_ = 2;
    local_8a8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_408 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_400 = "run";
    local_3f8 = 0x60000002e9;
    location_02.function = "run";
    location_02.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_02.lineNumber = 0x2e9;
    location_02.columnNumber = 0x60;
    raceSuccessful<int>(&local_888,location_02);
    local_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_418 = "run";
    local_410 = 0x60000002e9;
    uVar19 = 0x60000002e9;
    _Var7 = Promise<int>::wait((Promise<int> *)&local_888,&local_360);
    ppcVar18 = &local_7c0;
    local_7c0 = (char *)CONCAT44(local_7c0._4_4_,_Var7);
    psVar14 = &local_7e8.size_;
    kj::_::Debug::log<char_const(&)[105],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2e9,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope)"
               ,(char (*) [105])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))"
               ,local_7a8,(int *)psVar14,(int *)ppcVar18);
    pPVar10 = local_888.ptr;
    if ((PromiseArenaMember *)local_888.ptr != (PromiseArenaMember *)0x0) {
      local_888.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
    }
    sVar2 = local_8a8.size_;
    pPVar10 = local_8a8.ptr;
    if ((PromiseArenaMember *)local_8a8.ptr != (PromiseArenaMember *)0x0) {
      local_8a8.ptr = (Promise<int> *)0x0;
      local_8a8.size_ = 0;
      (**(local_8a8.disposer)->_vptr_ArrayDisposer)
                (local_8a8.disposer,pPVar10,8,sVar2,sVar2,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,psVar14,ppcVar18,uVar19);
    }
  }
  pEVar9 = local_858;
  if (local_858 != (Event *)0x0) {
    local_858 = (Event *)0x0;
    (**((Disposer *)&pAStack_860->_vptr_ArrayDisposer)->_vptr_Disposer)
              (pAStack_860,
               (_func_int *)
               ((long)&(((PromiseFulfiller<int> *)&pEVar9->_vptr_Event)->super_PromiseRejector).
                       _vptr_PromiseRejector +
               (long)(((PromiseFulfiller<int> *)&pEVar9->_vptr_Event)->super_PromiseRejector).
                     _vptr_PromiseRejector[-2]));
  }
  auVar3 = local_868;
  if (local_868 != (undefined1  [8])0x0) {
    local_868 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
  }
  if (lStack_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  _local_358 = CONCAT44(uStack_354,0xffffffff);
  lStack_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar19 = local_7a8[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_7a8[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:752:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_006272c8;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_7a8[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:752:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar19 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006272c8;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar19 = local_7a8[0]._0_8_;
  if ((PromiseArenaMember *)local_7a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_7a8[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  yield();
  uVar19 = local_7a8[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_7a8[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:753:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627320;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_7a8[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:753:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar19 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627320;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar19 = local_7a8[0]._0_8_;
  if ((PromiseArenaMember *)local_7a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_7a8[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  local_868 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((EventPort *)local_868)->_vptr_EventPort = (_func_int **)pTVar12;
  ((EventPort *)((long)local_868 + 8))->_vptr_EventPort = (_func_int **)pTVar11;
  pAStack_860 = (ArrayDisposer *)0x2;
  local_858 = (Event *)&kj::_::HeapArrayDisposer::instance;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_430 = "run";
  local_428 = 0x58000002f3;
  location_03.function = "run";
  location_03.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_03.lineNumber = 0x2f3;
  location_03.columnNumber = 0x58;
  raceSuccessful<int>(&local_8a8,location_03);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_448 = "run";
  local_440 = 0x58000002f3;
  uVar19 = 0x58000002f3;
  pcVar13 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar17 = "run";
  local_7a8[0].right = Promise<int>::wait((Promise<int> *)&local_8a8,&local_360);
  pPVar10 = local_8a8.ptr;
  local_7a8[0].result = local_7a8[0].right == 0x7b;
  local_7a8[0].left = 0x7b;
  local_7a8[0].op.content.ptr = " == ";
  local_7a8[0].op.content.size_ = 5;
  if ((PromiseArenaMember *)local_8a8.ptr != (PromiseArenaMember *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  pAVar4 = pAStack_860;
  auVar3 = local_868;
  if (local_868 != (undefined1  [8])0x0) {
    local_868 = (undefined1  [8])0x0;
    pAStack_860 = (ArrayDisposer *)0x0;
    (**local_858->_vptr_Event)
              (local_858,auVar3,8,pAVar4,pAVar4,ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct
               ,pcVar13,pcVar17,uVar19);
  }
  if ((local_7a8[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_888.ptr = (Promise<int> *)CONCAT44(local_888.ptr._4_4_,0x7b);
    local_868 = (undefined1  [8])
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    ((EventPort *)local_868)->_vptr_EventPort = (_func_int **)0x0;
    ((EventPort *)((long)local_868 + 8))->_vptr_EventPort = (_func_int **)0x0;
    pAStack_860 = (ArrayDisposer *)0x2;
    local_858 = (Event *)&kj::_::HeapArrayDisposer::instance;
    local_468 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_460 = "run";
    local_458 = 0x58000002f3;
    location_04.function = "run";
    location_04.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_04.lineNumber = 0x2f3;
    location_04.columnNumber = 0x58;
    raceSuccessful<int>(&local_8a8,location_04);
    local_480 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_478 = "run";
    local_470 = 0x58000002f3;
    uVar19 = 0x58000002f3;
    _Var7 = Promise<int>::wait((Promise<int> *)&local_8a8,&local_360);
    psVar14 = &local_7e8.size_;
    local_7e8.size_ = CONCAT44(local_7e8.size_._4_4_,_Var7);
    pAVar15 = pAVar16;
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2f3,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,local_7a8,(int *)pAVar16,(int *)psVar14);
    pPVar10 = local_8a8.ptr;
    if ((PromiseArenaMember *)local_8a8.ptr != (PromiseArenaMember *)0x0) {
      local_8a8.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
    }
    pAVar4 = pAStack_860;
    auVar3 = local_868;
    if (local_868 != (undefined1  [8])0x0) {
      local_868 = (undefined1  [8])0x0;
      pAStack_860 = (ArrayDisposer *)0x0;
      (**local_858->_vptr_Event)
                (local_858,auVar3,8,pAVar4,pAVar4,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pAVar15,psVar14,uVar19);
    }
  }
  if (lStack_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  _local_358 = CONCAT44(uStack_354,0xffffffff);
  lStack_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar19 = local_7a8[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_7a8[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:762:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627378;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_7a8[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:762:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar19 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627378;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar19 = local_7a8[0]._0_8_;
  if ((PromiseArenaMember *)local_7a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_7a8[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  yield();
  uVar19 = local_7a8[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_7a8[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:763:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_006273d0;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_7a8[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:763:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar19 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006273d0;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar19 = local_7a8[0]._0_8_;
  local_8a8.ptr = (Promise<int> *)pTVar11;
  if ((PromiseArenaMember *)local_7a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_7a8[0]._0_8_ = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  local_7a8[0]._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  local_7a8[0].op.content.ptr = "run";
  local_7a8[0].op.content.size_ = 0x12000002fb;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<int>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_868,(OwnPromiseNode *)&local_8a8,(SourceLocation *)local_7a8);
  auVar3 = local_868;
  pPVar10 = local_8a8.ptr;
  if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  local_868 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((EventPort *)local_868)->_vptr_EventPort = (_func_int **)pTVar12;
  ((EventPort *)((long)local_868 + 8))->_vptr_EventPort = (_func_int **)auVar3;
  pAStack_860 = (ArrayDisposer *)0x2;
  local_858 = (Event *)&kj::_::HeapArrayDisposer::instance;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_490 = "run";
  local_488 = 0x58000002fd;
  location_05.function = "run";
  location_05.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_05.lineNumber = 0x2fd;
  location_05.columnNumber = 0x58;
  raceSuccessful<int>(&local_8a8,location_05);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_4a8 = "run";
  local_4a0 = 0x58000002fd;
  uVar19 = 0x58000002fd;
  pcVar13 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar17 = "run";
  local_7a8[0].right = Promise<int>::wait((Promise<int> *)&local_8a8,&local_360);
  pPVar10 = local_8a8.ptr;
  local_7a8[0].result = local_7a8[0].right == 0x1c8;
  local_7a8[0].left = 0x1c8;
  local_7a8[0].op.content.ptr = " == ";
  local_7a8[0].op.content.size_ = 5;
  if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  pAVar4 = pAStack_860;
  auVar3 = local_868;
  if (local_868 != (undefined1  [8])0x0) {
    local_868 = (undefined1  [8])0x0;
    pAStack_860 = (ArrayDisposer *)0x0;
    (**local_858->_vptr_Event)
              (local_858,auVar3,8,pAVar4,pAVar4,ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct
               ,pcVar13,pcVar17,uVar19);
  }
  if ((local_7a8[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_888.ptr = (Promise<int> *)CONCAT44(local_888.ptr._4_4_,0x1c8);
    local_868 = (undefined1  [8])
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    ((EventPort *)local_868)->_vptr_EventPort = (_func_int **)0x0;
    ((EventPort *)((long)local_868 + 8))->_vptr_EventPort = (_func_int **)0x0;
    pAStack_860 = (ArrayDisposer *)0x2;
    local_858 = (Event *)&kj::_::HeapArrayDisposer::instance;
    local_4c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_4c0 = "run";
    local_4b8 = 0x58000002fd;
    location_06.function = "run";
    location_06.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_06.lineNumber = 0x2fd;
    location_06.columnNumber = 0x58;
    raceSuccessful<int>(&local_8a8,location_06);
    local_4e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_4d8 = "run";
    local_4d0 = 0x58000002fd;
    uVar19 = 0x58000002fd;
    _Var7 = Promise<int>::wait((Promise<int> *)&local_8a8,&local_360);
    psVar14 = &local_7e8.size_;
    local_7e8.size_ = CONCAT44(local_7e8.size_._4_4_,_Var7);
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2fd,ERROR,
               "\"failed: expected \" \"(456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,local_7a8,(int *)pAVar16,(int *)psVar14);
    pPVar10 = local_8a8.ptr;
    if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_8a8.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
    }
    pAVar4 = pAStack_860;
    auVar3 = local_868;
    if (local_868 != (undefined1  [8])0x0) {
      local_868 = (undefined1  [8])0x0;
      pAStack_860 = (ArrayDisposer *)0x0;
      (**local_858->_vptr_Event)
                (local_858,auVar3,8,pAVar4,pAVar4,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pAVar16,psVar14,uVar19);
    }
  }
  if (lStack_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  _local_358 = CONCAT44(uStack_354,0xffffffff);
  lStack_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar19 = local_7a8[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_7a8[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:772:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627428;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_7a8[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:772:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar19 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627428;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar19 = local_7a8[0]._0_8_;
  if ((PromiseArenaMember *)local_7a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_7a8[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  pAVar16 = &local_888;
  yield();
  pPVar10 = local_888.ptr;
  pPVar1 = *(PromiseArena **)((long)local_888.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_888.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)&local_888,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:773:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627480;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    *(PromiseArena **)((long)local_888.ptr + 8) = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_888.ptr + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)&local_888,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:773:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pPVar10 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627480;
    ((PromiseArenaMember *)((long)pPVar10 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1
    ;
  }
  local_7a8[0]._0_8_ = &DAT_004a8171;
  local_7a8[0].op.content.ptr = "then";
  local_7a8[0].op.content.size_ = (size_t)&DAT_4c0000058b;
  local_8a8.ptr = (Promise<int> *)pTVar11;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_868,(OwnPromiseNode *)&local_8a8,(SourceLocation *)local_7a8);
  auVar3 = local_868;
  pPVar10 = local_8a8.ptr;
  if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  pPVar10 = local_888.ptr;
  if ((PromiseArenaMember *)local_888.ptr != (PromiseArenaMember *)0x0) {
    local_888.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  local_868 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((EventPort *)local_868)->_vptr_EventPort = (_func_int **)pTVar12;
  ((EventPort *)((long)local_868 + 8))->_vptr_EventPort = (_func_int **)auVar3;
  pAStack_860 = (ArrayDisposer *)0x2;
  local_858 = (Event *)&kj::_::HeapArrayDisposer::instance;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_4f0 = "run";
  local_4e8 = 0x5800000309;
  location_07.function = "run";
  location_07.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_07.lineNumber = 0x309;
  location_07.columnNumber = 0x58;
  raceSuccessful<int>(&local_8a8,location_07);
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_508 = "run";
  local_500 = 0x5800000309;
  uVar19 = 0x5800000309;
  pcVar13 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar17 = "run";
  local_7a8[0].right = Promise<int>::wait((Promise<int> *)&local_8a8,&local_360);
  pPVar10 = local_8a8.ptr;
  local_7a8[0].result = local_7a8[0].right == 0x7b;
  local_7a8[0].left = 0x7b;
  local_7a8[0].op.content.ptr = " == ";
  local_7a8[0].op.content.size_ = 5;
  if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  pAVar4 = pAStack_860;
  auVar3 = local_868;
  if (local_868 != (undefined1  [8])0x0) {
    local_868 = (undefined1  [8])0x0;
    pAStack_860 = (ArrayDisposer *)0x0;
    (**local_858->_vptr_Event)
              (local_858,auVar3,8,pAVar4,pAVar4,ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct
               ,pcVar13,pcVar17,uVar19);
  }
  if ((local_7a8[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_888.ptr = (Promise<int> *)CONCAT44(local_888.ptr._4_4_,0x7b);
    local_868 = (undefined1  [8])
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    ((EventPort *)local_868)->_vptr_EventPort = (_func_int **)0x0;
    ((EventPort *)((long)local_868 + 8))->_vptr_EventPort = (_func_int **)0x0;
    pAStack_860 = (ArrayDisposer *)0x2;
    local_858 = (Event *)&kj::_::HeapArrayDisposer::instance;
    local_528 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_520 = "run";
    local_518 = 0x5800000309;
    location_08.function = "run";
    location_08.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_08.lineNumber = 0x309;
    location_08.columnNumber = 0x58;
    raceSuccessful<int>(&local_8a8,location_08);
    local_540 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_538 = "run";
    local_530 = 0x5800000309;
    uVar19 = 0x5800000309;
    _Var7 = Promise<int>::wait((Promise<int> *)&local_8a8,&local_360);
    psVar14 = &local_7e8.size_;
    local_7e8.size_ = CONCAT44(local_7e8.size_._4_4_,_Var7);
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x309,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,local_7a8,(int *)pAVar16,(int *)psVar14);
    pPVar10 = local_8a8.ptr;
    if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_8a8.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
    }
    pAVar4 = pAStack_860;
    auVar3 = local_868;
    if (local_868 != (undefined1  [8])0x0) {
      local_868 = (undefined1  [8])0x0;
      pAStack_860 = (ArrayDisposer *)0x0;
      (**local_858->_vptr_Event)
                (local_858,auVar3,8,pAVar4,pAVar4,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pAVar16,psVar14,uVar19);
    }
  }
  if (lStack_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  _local_358 = CONCAT44(uStack_354,0xffffffff);
  lStack_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  pAVar16 = &local_888;
  yield();
  pPVar10 = local_888.ptr;
  pPVar1 = *(PromiseArena **)((long)local_888.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_888.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_888,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:783:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_006274d8;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    *(PromiseArena **)((long)local_888.ptr + 8) = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_888.ptr + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_888,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:783:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pPVar10 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006274d8;
    ((PromiseArenaMember *)((long)pPVar10 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1
    ;
  }
  local_7a8[0]._0_8_ = &DAT_004a8171;
  local_7a8[0].op.content.ptr = "then";
  local_7a8[0].op.content.size_ = (size_t)&DAT_4c0000058b;
  local_8a8.ptr = (Promise<int> *)pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_868,(OwnPromiseNode *)&local_8a8,(SourceLocation *)local_7a8);
  auVar3 = local_868;
  pPVar10 = local_8a8.ptr;
  if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  pPVar10 = local_888.ptr;
  if ((PromiseArenaMember *)local_888.ptr != (PromiseArenaMember *)0x0) {
    local_888.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  yield();
  uVar19 = local_7a8[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_7a8[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:786:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627530;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_7a8[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_7a8[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_7a8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:786:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar19 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627530;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar19 = local_7a8[0]._0_8_;
  if ((PromiseArenaMember *)local_7a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_7a8[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  local_868 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  (((PromiseNode *)local_868)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)auVar3;
  (((PromiseNode *)local_868)->super_PromiseArenaMember).arena = (PromiseArena *)pTVar12;
  pAStack_860 = (ArrayDisposer *)0x2;
  local_858 = (Event *)&kj::_::HeapArrayDisposer::instance;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_550 = "run";
  local_548 = 0x5800000314;
  location_09.function = "run";
  location_09.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_09.lineNumber = 0x314;
  location_09.columnNumber = 0x58;
  raceSuccessful<int>(&local_8a8,location_09);
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_568 = "run";
  local_560 = 0x5800000314;
  uVar19 = 0x5800000314;
  pcVar13 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar17 = "run";
  local_7a8[0].right = Promise<int>::wait((Promise<int> *)&local_8a8,&local_360);
  pPVar10 = local_8a8.ptr;
  local_7a8[0].result = local_7a8[0].right == 0x7b;
  local_7a8[0].left = 0x7b;
  local_7a8[0].op.content.ptr = " == ";
  local_7a8[0].op.content.size_ = 5;
  if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  pAVar4 = pAStack_860;
  auVar3 = local_868;
  if (local_868 != (undefined1  [8])0x0) {
    local_868 = (undefined1  [8])0x0;
    pAStack_860 = (ArrayDisposer *)0x0;
    (**local_858->_vptr_Event)
              (local_858,auVar3,8,pAVar4,pAVar4,ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct
               ,pcVar13,pcVar17,uVar19);
  }
  if ((local_7a8[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_888.ptr = (Promise<int> *)CONCAT44(local_888.ptr._4_4_,0x7b);
    local_868 = (undefined1  [8])
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    (((PromiseNode *)local_868)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)0x0;
    (((PromiseNode *)local_868)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pAStack_860 = (ArrayDisposer *)0x2;
    local_858 = (Event *)&kj::_::HeapArrayDisposer::instance;
    local_588 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_580 = "run";
    local_578 = 0x5800000314;
    location_10.function = "run";
    location_10.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_10.lineNumber = 0x314;
    location_10.columnNumber = 0x58;
    raceSuccessful<int>(&local_8a8,location_10);
    local_5a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_598 = "run";
    local_590 = 0x5800000314;
    uVar19 = 0x5800000314;
    _Var7 = Promise<int>::wait((Promise<int> *)&local_8a8,&local_360);
    psVar14 = &local_7e8.size_;
    local_7e8.size_ = CONCAT44(local_7e8.size_._4_4_,_Var7);
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x314,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,local_7a8,(int *)pAVar16,(int *)psVar14);
    pPVar10 = local_8a8.ptr;
    if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_8a8.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
    }
    pAVar4 = pAStack_860;
    auVar3 = local_868;
    if (local_868 != (undefined1  [8])0x0) {
      local_868 = (undefined1  [8])0x0;
      pAStack_860 = (ArrayDisposer *)0x0;
      (**local_858->_vptr_Event)
                (local_858,auVar3,8,pAVar4,pAVar4,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pAVar16,psVar14,uVar19);
    }
  }
  if (lStack_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_868);
  local_8a8.size_ = CONCAT44(local_8a8.size_._4_4_,0xffffffff);
  local_8a8.disposer = (ArrayDisposer *)0x0;
  uStack_890 = 0;
  local_8a8.ptr = (Promise<int> *)local_868;
  EventLoop::enterScope((EventLoop *)local_868);
  yield();
  pPVar10 = local_888.ptr;
  pPVar1 = *(PromiseArena **)((long)local_888.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_888.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_888,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:795:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627588;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    *(PromiseArena **)((long)local_888.ptr + 8) = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_888.ptr + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_888,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:795:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pPVar10 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627588;
    ((PromiseArenaMember *)((long)pPVar10 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1
    ;
  }
  local_1c8 = (undefined1  [8])&DAT_004a8171;
  local_1c0.ownFile.content.ptr = "then";
  local_1c0.ownFile.content.size_ = (size_t)&DAT_4c0000058b;
  local_7a8[0]._0_8_ = pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_360,(OwnPromiseNode *)local_7a8,(SourceLocation *)local_1c8);
  PVar5.node.ptr = local_360.node.ptr;
  uVar19 = local_7a8[0]._0_8_;
  if ((TransformPromiseNodeBase *)local_7a8[0]._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_7a8[0]._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  pPVar10 = local_888.ptr;
  if ((PromiseArenaMember *)local_888.ptr != (PromiseArenaMember *)0x0) {
    local_888.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  yield();
  pPVar10 = local_888.ptr;
  pPVar1 = *(PromiseArena **)((long)local_888.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_888.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_888,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:798:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_006275e0;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    *(PromiseArena **)((long)local_888.ptr + 8) = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_888.ptr + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_888,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:798:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pPVar10 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006275e0;
    ((PromiseArenaMember *)((long)pPVar10 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1
    ;
  }
  local_1c8 = (undefined1  [8])&DAT_004a8171;
  local_1c0.ownFile.content.ptr = "then";
  local_1c0.ownFile.content.size_ = (size_t)&DAT_4c0000058b;
  local_7a8[0]._0_8_ = pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_360,(OwnPromiseNode *)local_7a8,(SourceLocation *)local_1c8);
  PVar6.node.ptr = local_360.node.ptr;
  uVar19 = local_7a8[0]._0_8_;
  if ((TransformPromiseNodeBase *)local_7a8[0]._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_7a8[0]._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  pPVar10 = local_888.ptr;
  if ((PromiseArenaMember *)local_888.ptr != (PromiseArenaMember *)0x0) {
    local_888.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  local_888.ptr =
       (Promise<int> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((local_888.ptr)->super_PromiseBase).node.ptr = (PromiseNode *)PVar5.node.ptr;
  local_888.ptr[1].super_PromiseBase.node.ptr = (PromiseNode *)PVar6.node.ptr;
  local_888.size_ = 2;
  local_888.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_7e8.size_ = 0x4a8040;
  local_7e8.disposer = (ArrayDisposer *)0x4a858a;
  local_7d0 = 0x6100000322;
  location_11.function = "operator()";
  location_11.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_11.lineNumber = 0x322;
  location_11.columnNumber = 0x61;
  raceSuccessful<int>(&local_7e8,location_11);
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_7b8 = "operator()";
  local_7b0 = 0x6100000322;
  uVar19 = 0x6100000322;
  pcVar13 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar17 = "operator()";
  Promise<int>::wait((Promise<int> *)&local_7e8,&local_8a8);
  pPVar10 = local_7e8.ptr;
  if ((PromiseArenaMember *)local_7e8.ptr != (PromiseArenaMember *)0x0) {
    local_7e8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  sVar2 = local_888.size_;
  pPVar10 = local_888.ptr;
  if (local_888.ptr != (Promise<int> *)0x0) {
    local_888.ptr = (Promise<int> *)0x0;
    local_888.size_ = 0;
    (**(local_888.disposer)->_vptr_ArrayDisposer)
              (local_888.disposer,pPVar10,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pcVar13,pcVar17,uVar19);
  }
  local_360.node.ptr = (OwnPromiseNode)((ulong)local_360.node.ptr & 0xffffffffffffff00);
  local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffffffffff00);
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[89]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x322,ERROR,
               "\"code did not throw: \" \"raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)\""
               ,(char (*) [89])
                "code did not throw: raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
              );
  }
  if (local_1c8[0] == '\x01') {
    Exception::~Exception(&local_1c0);
  }
  if (local_8a8.disposer == (ArrayDisposer *)0x0) {
    EventLoop::leaveScope((EventLoop *)local_8a8.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_868);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  _local_358 = CONCAT44(uStack_354,0xffffffff);
  lStack_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  auVar3 = local_870;
  pPVar1 = ((PromiseArenaMember *)local_870)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_870 - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_870,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:819:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_00627688;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_870)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)((long)local_870 + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_870,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:819:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)auVar3 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627688;
    ((PromiseArenaMember *)((long)auVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_7a8[0]._0_8_ = &DAT_004a8171;
  local_7a8[0].op.content.ptr = "then";
  local_7a8[0].op.content.size_ = (size_t)&DAT_4c0000058b;
  local_8a8.ptr = (Promise<int> *)pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_868,(OwnPromiseNode *)&local_8a8,(SourceLocation *)local_7a8);
  auVar3 = local_868;
  pPVar10 = local_8a8.ptr;
  if ((TransformPromiseNodeBase *)local_8a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_8a8.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar10);
  }
  node = local_870;
  if (local_870 != (undefined1  [8])0x0) {
    local_870 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  pEVar9 = (Event *)operator_new(0x18);
  pEVar9->next = (Event *)0x0;
  pEVar9->_vptr_Event = (_func_int **)&PTR_reject_006276e0;
  pEVar9->loop = (EventLoop *)&PTR_disposeImpl_00627718;
  pvVar8 = operator_new(0x400);
  pAStack_860 = (ArrayDisposer *)&pEVar9->loop;
  *(undefined8 *)((long)pvVar8 + 0x230) = 0;
  *(undefined8 *)((long)pvVar8 + 0x238) = 0;
  *(undefined ***)((long)pvVar8 + 0x228) = &PTR_destroy_006277b8;
  *(undefined ***)((long)pvVar8 + 0x240) = &PTR_reject_00627808;
  *(undefined1 *)((long)pvVar8 + 0x248) = 0;
  *(undefined1 *)((long)pvVar8 + 0x3e0) = 0;
  *(undefined1 *)((long)pvVar8 + 1000) = 1;
  *(Event **)((long)pvVar8 + 0x3f0) = (Event *)((long)pvVar8 + 0x240);
  *(Event **)((long)pvVar8 + 0x3f8) = pEVar9;
  pEVar9->next = (Event *)((long)pvVar8 + 0x240);
  *(void **)((long)pvVar8 + 0x230) = pvVar8;
  local_868 = (undefined1  [8])((long)pvVar8 + 0x228);
  local_858 = pEVar9;
  pPVar10 = (Promise<int> *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  (pPVar10->super_PromiseBase).node.ptr = (PromiseNode *)auVar3;
  pPVar10[1].super_PromiseBase.node.ptr = (PromiseNode *)((long)pvVar8 + 0x228);
  local_868 = (undefined1  [8])0x0;
  local_8a8.size_ = 2;
  local_8a8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_5b0 = "run";
  local_5a8 = 0x2a00000337;
  location_12.function = "run";
  location_12.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_12.lineNumber = 0x337;
  location_12.columnNumber = 0x2a;
  local_8a8.ptr = pPVar10;
  raceSuccessful<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
            ((Array<kj::Promise<NoCopy>_> *)local_870,location_12);
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_5c8 = "run";
  local_5c0 = 0x2a00000337;
  local_7a8[0].right = Promise<NoCopy>::wait((Promise<NoCopy> *)local_870,&local_360);
  auVar3 = local_870;
  local_7a8[0].result = local_7a8[0].right == 0x7b;
  local_7a8[0].left = 0x7b;
  local_7a8[0].op.content.ptr = " == ";
  local_7a8[0].op.content.size_ = 5;
  if (local_870 != (undefined1  [8])0x0) {
    local_870 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
  }
  local_8a8.ptr = (Promise<int> *)0x0;
  local_8a8.size_ = 0;
  kj::_::HeapArrayDisposer::disposeImpl
            ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pPVar10,8,2,2,
             ArrayDisposer::Dispose_<kj::Promise<NoCopy>_>::destruct);
  if ((local_7a8[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_7c4 = 0x7b;
    pPVar10 = (Promise<int> *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    (pPVar10->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    pPVar10[1].super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    local_868 = (undefined1  [8])0x0;
    local_8a8.size_ = 2;
    local_8a8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_5e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_5e0 = "run";
    local_5d8 = 0x2a00000337;
    location_13.function = "run";
    location_13.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_13.lineNumber = 0x337;
    location_13.columnNumber = 0x2a;
    local_8a8.ptr = pPVar10;
    raceSuccessful<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
              ((Array<kj::Promise<NoCopy>_> *)local_870,location_13);
    local_600 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_5f8 = "run";
    local_5f0 = 0x2a00000337;
    local_604 = Promise<NoCopy>::wait((Promise<NoCopy> *)local_870,&local_360);
    kj::_::Debug::log<char_const(&)[108],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x337,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i)\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i"
               ,(char (*) [108])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i)"
               ,local_7a8,&local_7c4,&local_604);
    auVar3 = local_870;
    if (local_870 != (undefined1  [8])0x0) {
      local_870 = (undefined1  [8])0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
    }
    local_8a8.ptr = (Promise<int> *)0x0;
    local_8a8.size_ = 0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pPVar10,8,2,2,
               ArrayDisposer::Dispose_<kj::Promise<NoCopy>_>::destruct);
  }
  pEVar9 = local_858;
  if (local_858 != (Event *)0x0) {
    local_858 = (Event *)0x0;
    (*(code *)((*(EventLoop **)pAStack_860)->port).ptr)
              (pAStack_860,(_func_int *)((long)&pEVar9->_vptr_Event + (long)pEVar9->_vptr_Event[-2])
              );
  }
  auVar3 = local_868;
  if (local_868 != (undefined1  [8])0x0) {
    local_868 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
  }
  if (lStack_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  return;
}

Assistant:

TEST(Async, RaceSuccessful) {
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = newPromiseAndFulfiller<int>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = newPromiseAndFulfiller<int>(); // never fulfilled
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; }).eagerlyEvaluate(nullptr);

    EXPECT_EQ(456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    KJ_EXPECT_THROW(FAILED, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    struct NoCopy {
      int i;

      NoCopy(int i) : i(i) {}
      NoCopy(const NoCopy&) = delete;

      NoCopy(NoCopy&&) = default;
      NoCopy& operator=(NoCopy&&) = default;
    };

    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([]() -> kj::Promise<NoCopy> { return NoCopy(123); });
    kj::PromiseFulfillerPair<NoCopy> right = newPromiseAndFulfiller<NoCopy>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope).i);
  }
}